

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl_simd.h
# Opt level: O3

void __thiscall ImplSimd<SimdMMX>::RGB2YUV(ImplSimd<SimdMMX> *this,RGB *rgb,YUV420 *yuv)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  uint8_t *puVar8;
  ushort uVar9;
  uint uVar10;
  short sVar11;
  ulong uVar12;
  ushort uVar13;
  uint5 uVar14;
  ushort uVar15;
  uint5 uVar16;
  ushort uVar17;
  ushort uVar19;
  ushort uVar20;
  short sVar21;
  short sVar22;
  undefined8 uVar18;
  ushort uVar23;
  short sVar24;
  short sVar25;
  
  if (yuv->height_ != rgb->height_) {
    __assert_fail("yuv->height_ == rgb->height_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/magic3007[P]intel-simd/impl_simd.h"
                  ,0x3d,"virtual void ImplSimd<SimdMMX>::RGB2YUV(RGB *, YUV420 *) [SIMD = SimdMMX]")
    ;
  }
  if (yuv->width_ == rgb->width_) {
    if ((yuv->size_ & 3) == 0) {
      if (yuv->size_ != 0) {
        puVar3 = yuv->y_;
        puVar4 = yuv->u_;
        puVar5 = yuv->v_;
        puVar6 = rgb->r_;
        puVar7 = rgb->g_;
        puVar8 = rgb->b_;
        uVar12 = 0;
        do {
          uVar1 = *(undefined4 *)(puVar6 + uVar12);
          uVar9 = (ushort)(((uint7)(byte)((uint)uVar1 >> 0x18) << 0x30) >> 0x28);
          sVar11 = (short)(CONCAT25(uVar9,CONCAT14((char)((uint)uVar1 >> 0x10),uVar1)) >> 0x20);
          uVar17 = (ushort)(byte)uVar1;
          uVar2 = *(undefined4 *)(puVar7 + uVar12);
          uVar10 = (uint)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((uint)uVar2 >> 0x18) <<
                                                           0x30) >> 0x28),
                                                   CONCAT14((char)((uint)uVar2 >> 0x10),uVar2)) >>
                                         0x20),uVar2) >> 0x18);
          uVar16 = (uint5)uVar10 & 0xffffffff00;
          uVar23 = (ushort)(CONCAT43(uVar10,CONCAT12((char)((uint)uVar2 >> 8),(ushort)uVar2)) >>
                           0x10) & 0xff;
          uVar15 = (ushort)uVar2 & 0xff;
          uVar2 = *(undefined4 *)(puVar8 + uVar12);
          uVar10 = (uint)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((uint)uVar2 >> 0x18) <<
                                                           0x30) >> 0x28),
                                                   CONCAT14((char)((uint)uVar2 >> 0x10),uVar2)) >>
                                         0x20),uVar2) >> 0x18);
          uVar14 = (uint5)uVar10 & 0xffffffff00;
          uVar19 = (ushort)CONCAT41(uVar10,(char)((uint)uVar2 >> 8)) & 0xff;
          uVar13 = (ushort)(byte)uVar2;
          uVar20 = (ushort)(byte)((uint)uVar1 >> 8);
          uVar9 = uVar9 >> 8;
          sVar24 = (short)(uVar16 >> 8);
          sVar25 = (short)(uVar16 >> 0x18);
          sVar21 = (short)(uVar14 >> 8);
          sVar22 = (short)(uVar14 >> 0x18);
          uVar18 = psraw(CONCAT26(sVar22 * 0x19 + sVar25 * 0x81 + uVar9 * 0x42 + 0x80,
                                  CONCAT24(sVar21 * 0x19 + sVar24 * 0x81 + sVar11 * 0x42 + 0x80,
                                           CONCAT22(uVar19 * 0x19 + uVar23 * 0x81 + uVar20 * 0x42 +
                                                    0x80,uVar13 * 0x19 +
                                                         uVar15 * 0x81 + uVar17 * 0x42 + 0x80))),8);
          uVar18 = packsswb(CONCAT26((short)((ulong)uVar18 >> 0x30) + 0x10,
                                     CONCAT24((short)((ulong)uVar18 >> 0x20) + 0x10,
                                              CONCAT22((short)((ulong)uVar18 >> 0x10) + 0x10,
                                                       (short)uVar18 + 0x10))),0);
          *(int *)(puVar3 + uVar12) = (int)uVar18;
          uVar18 = psraw(CONCAT26(sVar22 * 0x70 + uVar9 * -0x26 + sVar25 * -0x4a + 0x80,
                                  CONCAT24(sVar21 * 0x70 + sVar11 * -0x26 + sVar24 * -0x4a + 0x80,
                                           CONCAT22(uVar19 * 0x70 + uVar20 * -0x26 + uVar23 * -0x4a
                                                    + 0x80,uVar13 * 0x70 + uVar17 * -0x26 +
                                                           uVar15 * -0x4a + 0x80))),8);
          uVar18 = packsswb(CONCAT26((short)((ulong)uVar18 >> 0x30) + 0x80,
                                     CONCAT24((short)((ulong)uVar18 >> 0x20) + 0x80,
                                              CONCAT22((short)((ulong)uVar18 >> 0x10) + 0x80,
                                                       (short)uVar18 + 0x80))),0);
          *(int *)(puVar4 + uVar12) = (int)uVar18;
          uVar18 = psraw(CONCAT26(uVar9 * 0x70 + sVar25 * -0x5e + sVar22 * -0x12 + 0x80,
                                  CONCAT24(sVar11 * 0x70 + sVar24 * -0x5e + sVar21 * -0x12 + 0x80,
                                           CONCAT22(uVar20 * 0x70 + uVar23 * -0x5e + uVar19 * -0x12
                                                    + 0x80,uVar17 * 0x70 + uVar15 * -0x5e +
                                                           uVar13 * -0x12 + 0x80))),8);
          uVar18 = packsswb(CONCAT26((short)((ulong)uVar18 >> 0x30) + 0x80,
                                     CONCAT24((short)((ulong)uVar18 >> 0x20) + 0x80,
                                              CONCAT22((short)((ulong)uVar18 >> 0x10) + 0x80,
                                                       (short)uVar18 + 0x80))),0);
          *(int *)(puVar5 + uVar12) = (int)uVar18;
          uVar12 = uVar12 + 4;
        } while (uVar12 < yuv->size_);
      }
      return;
    }
    __assert_fail("yuv->size_ % kStride == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/magic3007[P]intel-simd/impl_simd.h"
                  ,0x3f,"virtual void ImplSimd<SimdMMX>::RGB2YUV(RGB *, YUV420 *) [SIMD = SimdMMX]")
    ;
  }
  __assert_fail("yuv->width_ == rgb->width_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/magic3007[P]intel-simd/impl_simd.h"
                ,0x3e,"virtual void ImplSimd<SimdMMX>::RGB2YUV(RGB *, YUV420 *) [SIMD = SimdMMX]");
}

Assistant:

void ImplSimd<SIMD>::RGB2YUV(RGB *rgb, YUV420 *yuv) {
  assert(yuv->height_ == rgb->height_);
  assert(yuv->width_ == rgb->width_);
  assert(yuv->size_ % kStride == 0);

  auto y = yuv->y_;
  auto u = yuv->u_;
  auto v = yuv->v_;
  auto r = rgb->r_;
  auto g = rgb->g_;
  auto b = rgb->b_;

  for(size_t i = 0; i < yuv->size_; i += kStride){
    Vector c = load(r+i);
    Vector d = load(g+i);
    Vector e = load(b+i);

    /*
    y[i] = clamp(((66 * c + 129 * d + 25 * e + 128) >> 8) + 16);
    u[i] = clamp(((-38 * c - 74 * d + 112 * e + 128) >> 8) + 128);
    v[i] = clamp(((112 * c - 94 * d - 18 * e + 128) >> 8) + 128);
     */
    store(add(rli(add(add(add(mul(cn(66),c), mul(cn(129), d)), mul(cn(25), e)), cn(128)),8), cn(16)), y+i);
    store(add(rli(add(sub(sub(mul(cn(112),e), mul(cn(38), c)), mul(cn(74), d)), cn(128)),8), cn(128)), u+i);
    store(add(rli(add(sub(sub(mul(cn(112),c), mul(cn(94), d)), mul(cn(18), e)), cn(128)),8), cn(128)), v+i);
    SIMD::Empty();
  }

}